

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall
UtestShell::fail(UtestShell *this,char *text,char *fileName,size_t lineNumber,
                TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  SimpleString SStack_a8;
  TestFailure local_98;
  
  pTVar1 = getTestResult(this);
  (*pTVar1->_vptr_TestResult[10])(pTVar1);
  SimpleString::SimpleString(&SStack_a8,text);
  FailFailure::FailFailure((FailFailure *)&local_98,this,fileName,lineNumber,&SStack_a8);
  (*this->_vptr_UtestShell[0x27])(this,&local_98,testTerminator);
  TestFailure::~TestFailure(&local_98);
  SimpleString::~SimpleString(&SStack_a8);
  return;
}

Assistant:

void UtestShell::fail(const char *text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    failWith(FailFailure(this, fileName, lineNumber, text), testTerminator);
}